

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gls::(anonymous_namespace)::getShaderInfoLog_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Functions *gl,deUint32 shader)

{
  code *pcVar1;
  undefined4 uVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 local_20;
  undefined4 local_1c;
  deInt32 length;
  deUint32 shader_local;
  Functions *gl_local;
  string *infoLog;
  
  local_1c = SUB84(gl,0);
  local_20 = 0;
  _length = this;
  gl_local = (Functions *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  (**(code **)(_length + 0xa70))(local_1c,0x8b84,&local_20);
  dVar3 = (**(code **)(_length + 0x800))();
  glu::checkError(dVar3,"glGetShaderiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x139);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)local_20);
  uVar2 = local_1c;
  pcVar1 = *(code **)(_length + 0xa58);
  uVar4 = std::__cxx11::string::length();
  uVar5 = std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  (*pcVar1)(uVar2,uVar4,0,uVar5);
  dVar3 = (**(code **)(_length + 0x800))();
  glu::checkError(dVar3,"glGetShaderInfoLog()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x13e);
  return __return_storage_ptr__;
}

Assistant:

string getShaderInfoLog (const glw::Functions& gl, deUint32 shader)
{
	deInt32	length = 0;
	string	infoLog;

	gl.getShaderiv(shader, GL_INFO_LOG_LENGTH, &length);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv()");

	infoLog.resize(length, '\0');

	gl.getShaderInfoLog(shader, (glw::GLsizei)infoLog.length(), DE_NULL, &(infoLog[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog()");

	return infoLog;
}